

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O0

void VP8LConvertFromBGRA(uint32_t *in_data,int num_pixels,WEBP_CSP_MODE out_colorspace,uint8_t *rgba
                        )

{
  uint8_t *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  uint32_t *in_RDI;
  uint32_t *unaff_retaddr;
  int swap_on_big_endian;
  int num_pixels_00;
  
  swap_on_big_endian = (int)((ulong)in_RCX >> 0x20);
  num_pixels_00 = (int)((ulong)in_RDI >> 0x20);
  switch(in_EDX) {
  case 0:
    (*VP8LConvertBGRAToRGB)(in_RDI,in_ESI,in_RCX);
    break;
  case 1:
    (*VP8LConvertBGRAToRGBA)(in_RDI,in_ESI,in_RCX);
    break;
  case 2:
    (*VP8LConvertBGRAToBGR)(in_RDI,in_ESI,in_RCX);
    break;
  case 3:
    CopyOrSwap(unaff_retaddr,num_pixels_00,(uint8_t *)CONCAT44(in_ESI,in_EDX),swap_on_big_endian);
    break;
  case 4:
    CopyOrSwap(unaff_retaddr,num_pixels_00,(uint8_t *)CONCAT44(in_ESI,in_EDX),swap_on_big_endian);
    break;
  case 5:
    (*VP8LConvertBGRAToRGBA4444)(in_RDI,in_ESI,in_RCX);
    break;
  case 6:
    (*VP8LConvertBGRAToRGB565)(in_RDI,in_ESI,in_RCX);
    break;
  case 7:
    (*VP8LConvertBGRAToRGBA)(in_RDI,in_ESI,in_RCX);
    (*WebPApplyAlphaMultiply)(in_RCX,0,in_ESI,1,0);
    break;
  case 8:
    CopyOrSwap(unaff_retaddr,num_pixels_00,(uint8_t *)CONCAT44(in_ESI,in_EDX),swap_on_big_endian);
    (*WebPApplyAlphaMultiply)(in_RCX,0,in_ESI,1,0);
    break;
  case 9:
    CopyOrSwap(unaff_retaddr,num_pixels_00,(uint8_t *)CONCAT44(in_ESI,in_EDX),swap_on_big_endian);
    (*WebPApplyAlphaMultiply)(in_RCX,1,in_ESI,1,0);
    break;
  case 10:
    (*VP8LConvertBGRAToRGBA4444)(in_RDI,in_ESI,in_RCX);
    (*WebPApplyAlphaMultiply4444)(in_RCX,in_ESI,1,0);
  }
  return;
}

Assistant:

void VP8LConvertFromBGRA(const uint32_t* const in_data, int num_pixels,
                         WEBP_CSP_MODE out_colorspace, uint8_t* const rgba) {
  switch (out_colorspace) {
    case MODE_RGB:
      VP8LConvertBGRAToRGB(in_data, num_pixels, rgba);
      break;
    case MODE_RGBA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA:
      VP8LConvertBGRAToRGBA(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_BGR:
      VP8LConvertBGRAToBGR(in_data, num_pixels, rgba);
      break;
    case MODE_BGRA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      break;
    case MODE_bgrA:
      CopyOrSwap(in_data, num_pixels, rgba, 1);
      WebPApplyAlphaMultiply(rgba, 0, num_pixels, 1, 0);
      break;
    case MODE_ARGB:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      break;
    case MODE_Argb:
      CopyOrSwap(in_data, num_pixels, rgba, 0);
      WebPApplyAlphaMultiply(rgba, 1, num_pixels, 1, 0);
      break;
    case MODE_RGBA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      break;
    case MODE_rgbA_4444:
      VP8LConvertBGRAToRGBA4444(in_data, num_pixels, rgba);
      WebPApplyAlphaMultiply4444(rgba, num_pixels, 1, 0);
      break;
    case MODE_RGB_565:
      VP8LConvertBGRAToRGB565(in_data, num_pixels, rgba);
      break;
    default:
      assert(0);          // Code flow should not reach here.
  }
}